

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQClosure::Release(SQClosure *this)

{
  SQFunctionProto *pSVar1;
  long lVar2;
  long lVar3;
  long local_30;
  SQInteger nl_1;
  SQInteger nl;
  SQInteger size;
  SQFunctionProto *f;
  SQClosure *this_local;
  
  pSVar1 = this->_function;
  lVar2 = pSVar1->_noutervalues;
  lVar3 = pSVar1->_ndefaultparams;
  for (nl_1 = 0; nl_1 < pSVar1->_noutervalues; nl_1 = nl_1 + 1) {
    ::SQObjectPtr::~SQObjectPtr(this->_outervalues + nl_1);
  }
  for (local_30 = 0; local_30 < pSVar1->_ndefaultparams; local_30 = local_30 + 1) {
    ::SQObjectPtr::~SQObjectPtr(this->_defaultparams + local_30);
  }
  if (this->_function != (SQFunctionProto *)0x0) {
    (this->_function->super_SQCollectable).super_SQRefCounted._uiRef =
         (this->_function->super_SQCollectable).super_SQRefCounted._uiRef - 1;
    if ((this->_function->super_SQCollectable).super_SQRefCounted._uiRef == 0) {
      (*(this->_function->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_function = (SQFunctionProto *)0x0;
  }
  (**(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)();
  sq_vm_free(this,lVar2 * 0x10 + 0x60 + lVar3 * 0x10);
  return;
}

Assistant:

void Release(){
        SQFunctionProto *f = _function;
        SQInteger size = _CALC_CLOSURE_SIZE(f);
        _DESTRUCT_VECTOR(SQObjectPtr,f->_noutervalues,_outervalues);
        _DESTRUCT_VECTOR(SQObjectPtr,f->_ndefaultparams,_defaultparams);
        __ObjRelease(_function);
        this->~SQClosure();
        sq_vm_free(this,size);
    }